

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

uint Memory::ValidPointers<SmallAllocationBlockAttributes>::CalculateBucketInfo
               (uint bucketIndex,uint *indexPerObject)

{
  uint uVar1;
  uint bucketSize;
  uint *indexPerObject_local;
  uint bucketIndex_local;
  
  uVar1 = bucketIndex * 0x10 + 0x10;
  *indexPerObject = uVar1 >> 4;
  return (uint)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(uVar1),0) * (ulong)uVar1 >>
               4);
}

Assistant:

uint ValidPointers<TBlockAttributes>::CalculateBucketInfo(uint bucketIndex, uint * indexPerObject)
{
    uint bucketSize;
    if (TBlockAttributes::IsSmallBlock)
    {
        bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * bucketIndex;
    }
    else
    {
        bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (bucketIndex + 1);
    }
    *indexPerObject = bucketSize / HeapConstants::ObjectGranularity;
    return ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize) * bucketSize / HeapConstants::ObjectGranularity;
}